

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O2

QuaternionT<float> __thiscall
Gs::Slerp<Gs::QuaternionT<float>,float>
          (Gs *this,QuaternionT<float> *from,QuaternionT<float> *to,float *t)

{
  float fVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined8 uVar3;
  uint uVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  QuaternionT<float> QVar8;
  float local_60;
  float local_5c;
  float local_58;
  undefined4 uStack_54;
  float local_48;
  float local_38;
  undefined1 auVar4 [16];
  
  fVar1 = Dot<Gs::QuaternionT<float>,float>(from,to);
  fVar2 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar2 = fVar1;
  }
  if (1.0 - fVar2 <= 1.1920929e-07) {
    uVar3 = CONCAT44(*t,1.0 - *t);
  }
  else {
    local_38 = fVar1;
    fVar2 = acosf(fVar2);
    local_48 = sinf(fVar2);
    local_58 = sinf((1.0 - *t) * fVar2);
    uStack_54 = extraout_XMM0_Db;
    fVar2 = sinf(fVar2 * *t);
    auVar5._4_4_ = uStack_54;
    auVar5._0_4_ = local_58;
    auVar5._8_4_ = uStack_54;
    auVar5._12_4_ = extraout_XMM0_Db_00;
    auVar4._8_8_ = auVar5._8_8_;
    auVar4._4_4_ = fVar2;
    auVar4._0_4_ = local_58;
    auVar6._4_4_ = local_48;
    auVar6._0_4_ = local_48;
    auVar6._8_4_ = local_48;
    auVar6._12_4_ = local_48;
    auVar6 = divps(auVar4,auVar6);
    uVar3 = auVar6._0_8_;
    fVar1 = local_38;
  }
  local_5c = (float)uVar3;
  uVar7 = (uint)((ulong)uVar3 >> 0x20);
  local_60 = (float)(~-(uint)(fVar1 < 0.0) & uVar7 | (uVar7 ^ 0x80000000) & -(uint)(fVar1 < 0.0));
  QVar8 = Mix<Gs::QuaternionT<float>,float>(this,from,to,&local_5c,&local_60);
  return QVar8;
}

Assistant:

TVector Slerp(const TVector& from, const TVector& to, const TScalar& t)
{
    TScalar omega, cosom, sinom;
    TScalar scale0, scale1;

    /* Calculate cosine */
    cosom = Dot<TVector, TScalar>(from, to);

    /* Adjust signs (if necessary) */
    if (cosom < TScalar(0))
    {
        cosom = -cosom;
        scale1 = TScalar(-1);
    }
    else
        scale1 = TScalar(1);

    /* Calculate coefficients */
    if ((TScalar(1) - cosom) > std::numeric_limits<TScalar>::epsilon())
    {
        /* Standard case (slerp) */
        omega = std::acos(cosom);
        sinom = std::sin(omega);
        scale0 = std::sin((TScalar(1) - t) * omega) / sinom;
        scale1 *= std::sin(t * omega) / sinom;
    }
    else
    {
        /* 'from' and 'to' quaternions are very close, so we can do a linear interpolation */
        scale0 = TScalar(1) - t;
        scale1 *= t;
    }

    /* Calculate final values */
    return Mix(from, to, scale0, scale1);
}